

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O1

Result RunSpecificExports(Ptr *instance,Errors *errors,
                         vector<FunctionCall,_std::allocator<FunctionCall>_> *calls)

{
  size_t __n;
  ExternType *pEVar1;
  int iVar2;
  Result RVar3;
  pointer pFVar4;
  pointer pFVar5;
  Enum EVar6;
  pointer pEVar7;
  string_view name;
  Ptr trap;
  RefPtr<wabt::interp::Func> func;
  Values results;
  RefPtr<wabt::interp::Module> module;
  Ptr *in_stack_ffffffffffffff20;
  Ptr local_d8;
  RefPtr<wabt::interp::Func> local_b8;
  Values local_98;
  RefPtr<wabt::interp::Module> local_78;
  pointer local_58;
  vector<FunctionCall,_std::allocator<FunctionCall>_> *local_50;
  Ptr *local_48;
  pointer local_40;
  FuncType *local_38;
  
  local_50 = calls;
  local_48 = instance;
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&local_78,&s_store,(Ref)(instance->obj_->module_).index);
  pEVar7 = ((local_78.obj_)->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_58 = ((local_78.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  EVar6 = Ok;
  if (pEVar7 != local_58) {
    do {
      pFVar5 = (local_50->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pFVar4 = (local_50->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_40 = pFVar4;
      if (pFVar5 != pFVar4) {
        do {
          __n = (pEVar7->type).name._M_string_length;
          if (__n == (pFVar5->name)._M_string_length) {
            if (__n != 0) {
              iVar2 = bcmp((pEVar7->type).name._M_dataplus._M_p,(pFVar5->name)._M_dataplus._M_p,__n)
              ;
              if (iVar2 != 0) goto LAB_001116e0;
            }
            if (((pEVar7->type).type._M_t.
                 super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                 .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind !=
                First) {
              printf("Export \'%s\' is not a function\n",(pEVar7->type).name._M_dataplus._M_p);
LAB_00111785:
              exit(1);
            }
            if (s_trace_stream != (Stream *)0x0) {
              wabt::Stream::Writef
                        (s_trace_stream,">>> running export \"%s\":\n",
                         (pFVar5->name)._M_dataplus._M_p);
            }
            pEVar1 = (pEVar7->type).type._M_t.
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
            if (pEVar1->kind != First) {
              __assert_fail("isa<Derived>(base)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                            ,0x4e,
                            "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
                           );
            }
            if ((int)((ulong)(*(long *)&pEVar1[1].kind - (long)pEVar1[1]._vptr_ExternType) >> 3) !=
                (int)((ulong)((long)(pFVar5->args).
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar5->args).
                                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
              printf("Exported function \'%s\' expects %d arguments, but %d were provided\n",
                     (pEVar7->type).name._M_dataplus._M_p);
              goto LAB_00111785;
            }
            local_38 = (FuncType *)&pFVar5->args;
            wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
                      (&local_b8,&s_store,
                       (Ref)(local_48->obj_->funcs_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start[pEVar7->index].index);
            local_98.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8.root_index_ = 0;
            local_d8.obj_ = (Trap *)0x0;
            local_d8.store_ = (Store *)0x0;
            RVar3 = wabt::interp::Func::Call
                              (local_b8.obj_,&s_store,&pFVar5->args,&local_98,&local_d8,
                               s_trace_stream);
            name._M_str = (char *)pEVar1;
            name._M_len = (size_t)(pEVar7->type).name._M_dataplus._M_p;
            wabt::interp::WriteCall
                      ((interp *)
                       s_stdout_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                       (Stream *)(pEVar7->type).name._M_string_length,name,local_38,&local_98,
                       (Values *)&local_d8,in_stack_ffffffffffffff20);
            if (local_d8.obj_ != (Trap *)0x0) {
              wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
              local_d8.obj_ = (Trap *)0x0;
              local_d8.store_ = (Store *)0x0;
              local_d8.root_index_ = 0;
            }
            if (local_98.
                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b8.obj_ != (Func *)0x0) {
              wabt::interp::Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
              local_b8.obj_ = (Func *)0x0;
              local_b8.store_ = (Store *)0x0;
              local_b8.root_index_ = 0;
            }
            EVar6 = (Enum)(EVar6 == Error || RVar3.enum_ == Error);
            pFVar4 = local_40;
          }
LAB_001116e0:
          pFVar5 = pFVar5 + 1;
        } while (pFVar5 != pFVar4);
      }
      pEVar7 = pEVar7 + 1;
    } while (pEVar7 != local_58);
  }
  if (local_78.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_78.store_,local_78.root_index_);
  }
  return (Result)EVar6;
}

Assistant:

Result RunSpecificExports(const Instance::Ptr& instance,
                          Errors* errors,
                          std::vector<FunctionCall>& calls) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    for (auto& call_ : calls) {
      if (export_.type.name == call_.name) {
        ERROR_EXIT_UNLESS(export_.type.type->kind == ExternalKind::Func,
                          "Export '%s' is not a function\n",
                          export_.type.name.c_str());

        if (s_trace_stream) {
          s_trace_stream->Writef(">>> running export \"%s\":\n",
                                 call_.name.c_str());
        }
        auto* func_type = cast<FuncType>(export_.type.type.get());
        int params_size = func_type->params.size();
        int args_size = call_.args.size();
        ERROR_EXIT_UNLESS(params_size == args_size,
                          "Exported function '%s' expects %d arguments, but %d "
                          "were provided\n",
                          export_.type.name.c_str(), params_size, args_size);

        auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
        Values results;
        Trap::Ptr trap;
        result |=
            func->Call(s_store, call_.args, results, &trap, s_trace_stream);
        WriteCall(s_stdout_stream.get(), export_.type.name, *func_type,
                  call_.args, results, trap);
      }
    }
  }

  return result;
}